

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O3

void av1_init_simple_motion_search_mvs_for_sb
               (AV1_COMP *cpi,TileInfo *tile_info,MACROBLOCK *x,SIMPLE_MOTION_DATA_TREE *sms_root,
               int mi_row,int mi_col)

{
  ulong uVar1;
  short *psVar2;
  long lVar3;
  FULLPEL_MV ref_mvs [8];
  MB_MODE_INFO_EXT mbmi_ext;
  
  ref_mvs[4].row = 0;
  ref_mvs[4].col = 0;
  ref_mvs[5].row = 0;
  ref_mvs[5].col = 0;
  ref_mvs[6].row = 0;
  ref_mvs[6].col = 0;
  ref_mvs[7].row = 0;
  ref_mvs[7].col = 0;
  ref_mvs[0].row = 0;
  ref_mvs[0].col = 0;
  ref_mvs[1].row = 0;
  ref_mvs[1].col = 0;
  ref_mvs[2].row = 0;
  ref_mvs[2].col = 0;
  ref_mvs[3].row = 0;
  ref_mvs[3].col = 0;
  if (tile_info != (TileInfo *)0x0) {
    av1_set_offsets_without_segment_id
              (cpi,tile_info,x,mi_row,mi_col,((cpi->common).seq_params)->sb_size);
  }
  lVar3 = 7;
  if ((cpi->rc).is_src_frame_alt_ref == 0) {
    lVar3 = 1;
  }
  av1_find_mv_refs(&cpi->common,&x->e_mbd,*(x->e_mbd).mi,(MV_REFERENCE_FRAME)lVar3,
                   mbmi_ext.ref_mv_count,(x->e_mbd).ref_mv_stack,(x->e_mbd).weight,
                   (int_mv (*) [2])0x0,mbmi_ext.global_mvs,mbmi_ext.mode_context);
  uVar1 = (ulong)(uint)((int)lVar3 * 4);
  psVar2 = (short *)((long)&(x->e_mbd).ref_mv_stack[0][0].this_mv + (ulong)(uint)((int)lVar3 << 6));
  if (mbmi_ext.ref_mv_count[lVar3] == '\0') {
    psVar2 = (short *)((long)mbmi_ext.global_mvs + uVar1);
  }
  *(uint *)((long)&ref_mvs[0].row + uVar1) =
       ((int)*psVar2 - (~(int)*psVar2 >> 0x1f)) + 3U >> 3 & 0xffff |
       ((int)psVar2[1] - (~(int)psVar2[1] >> 0x1f)) * 0x2000 + 0x6000U & 0xffff0000;
  init_simple_motion_search_mvs(sms_root,ref_mvs);
  return;
}

Assistant:

void av1_init_simple_motion_search_mvs_for_sb(const AV1_COMP *cpi,
                                              const TileInfo *tile_info,
                                              MACROBLOCK *x,
                                              SIMPLE_MOTION_DATA_TREE *sms_root,
                                              int mi_row, int mi_col) {
  // Use the NEARESTMV of the sb as the start mv
  const AV1_COMMON *cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  FULLPEL_MV ref_mvs[REF_FRAMES];
  const BLOCK_SIZE sb_size = cm->seq_params->sb_size;
  av1_zero(ref_mvs);
  // If tile_info is NULL, assume that the offsets have already been set.
  if (tile_info) {
    av1_set_offsets_without_segment_id(cpi, tile_info, x, mi_row, mi_col,
                                       sb_size);
  }

  MB_MODE_INFO_EXT mbmi_ext;
  const int ref_frame =
      cpi->rc.is_src_frame_alt_ref ? ALTREF_FRAME : LAST_FRAME;
  av1_find_mv_refs(cm, xd, xd->mi[0], ref_frame, mbmi_ext.ref_mv_count,
                   xd->ref_mv_stack, xd->weight, NULL, mbmi_ext.global_mvs,
                   mbmi_ext.mode_context);
  if (mbmi_ext.ref_mv_count[ref_frame] > 0) {
    ref_mvs[ref_frame] =
        get_fullmv_from_mv(&xd->ref_mv_stack[ref_frame][0].this_mv.as_mv);
  } else {
    ref_mvs[ref_frame] =
        get_fullmv_from_mv(&mbmi_ext.global_mvs[ref_frame].as_mv);
  }

  init_simple_motion_search_mvs(sms_root, ref_mvs);
}